

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

int __thiscall
FOptionMenuItemOptionBase::Draw
          (FOptionMenuItemOptionBase *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  uint uVar1;
  FBaseCVar *pFVar2;
  FOptionValues *pFVar3;
  Node *pNVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  Node *pNVar8;
  char *string;
  undefined8 uVar9;
  byte bVar10;
  
  pFVar2 = this->mGrayCheck;
  if (pFVar2 == (FBaseCVar *)0x0) {
    bVar10 = 0;
  }
  else {
    iVar5 = (*pFVar2->_vptr_FBaseCVar[4])(pFVar2,0);
    bVar10 = (byte)iVar5 ^ 1;
  }
  if (this->mCenter != 0) {
    indent = (screen->super_DSimpleCanvas).super_DCanvas.Width / 2;
  }
  lVar7 = 4;
  if (selected) {
    lVar7 = 0x18;
  }
  FOptionMenuItem::drawLabel
            (&this->super_FOptionMenuItem,indent,y,
             *(EColorRange *)((long)&OptionSettings.mTitleColor + lVar7),(bool)(bVar10 & 1));
  uVar6 = (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])(this);
  uVar1 = *(uint *)&(this->super_FOptionMenuItem).field_0x24;
  string = "Unknown";
  pNVar4 = OptionValues.Nodes + (OptionValues.Size - 1 & uVar1);
  do {
    pNVar8 = pNVar4;
    if ((pNVar8 == (Node *)0x0) || (pNVar8->Next == (Node *)0x1)) goto LAB_00308f73;
    pNVar4 = pNVar8->Next;
  } while ((pNVar8->Pair).Key.Index != uVar1);
  if ((-1 < (int)uVar6) && (pFVar3 = (pNVar8->Pair).Value, pFVar3 != (FOptionValues *)0x0)) {
    string = (pFVar3->mValues).Array[uVar6].Text.Chars;
  }
LAB_00308f73:
  if (*string == '$') {
    string = FStringTable::operator()(&GStrings,string + 1);
  }
  uVar9 = 0x60300000;
  if ((bVar10 & 1) == 0) {
    uVar9 = 0;
  }
  DCanvas::DrawText((DCanvas *)screen,SmallFont,OptionSettings.mFontColorValue,
                    CleanXfac_1 * 0xe + indent,y,string,0x40001394,1,0x400013aa,uVar9,0);
  return indent;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		bool grayed = mGrayCheck != NULL && !(mGrayCheck->GetGenericRep(CVAR_Bool).Bool);

		if (mCenter)
		{
			indent = (screen->GetWidth() / 2);
		}
		drawLabel(indent, y, selected? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, grayed);

		int overlay = grayed? MAKEARGB(96,48,0,0) : 0;
		const char *text;
		int Selection = GetSelection();
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (Selection < 0 || opt == NULL || *opt == NULL)
		{
			text = "Unknown";
		}
		else
		{
			text = (*opt)->mValues[Selection].Text;
		}
		if (*text == '$') text = GStrings(text + 1);
		screen->DrawText (SmallFont, OptionSettings.mFontColorValue, indent + CURSORSPACE, y, 
			text, DTA_CleanNoMove_1, true, DTA_ColorOverlay, overlay, TAG_DONE);
		return indent;
	}